

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O3

size_t __thiscall
axl::err::Error::formatStringError_va(Error *this,char *formatString,axl_va_list *va)

{
  undefined8 uVar1;
  ErrorHdr *pEVar2;
  size_t size;
  String string;
  char buffer [256];
  axl_va_list local_168;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_148;
  undefined1 local_128 [264];
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_148,BufKind_Exclusive,
             local_128,0x100);
  local_168._0_8_ = *(undefined8 *)va;
  local_168._8_8_ = *(undefined8 *)&va->field_0x8;
  local_168._16_8_ = *(undefined8 *)&va->field_0x10;
  local_168.m_isInitialized = true;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_148,formatString,
             &local_168);
  if (local_168.m_isInitialized == true) {
    local_168.m_isInitialized = false;
  }
  size = local_148.m_length + 0x19;
  pEVar2 = rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
                     (&this->
                       super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,size
                      ,false);
  if (pEVar2 == (ErrorHdr *)0x0) {
    size = 0xffffffffffffffff;
  }
  else {
    pEVar2->m_size = (uint32_t)size;
    uVar1 = g_stdErrorGuid._8_8_;
    *(undefined8 *)&(pEVar2->m_guid).field_0 = g_stdErrorGuid._0_8_;
    *(undefined8 *)((long)&(pEVar2->m_guid).field_0 + 8) = uVar1;
    pEVar2->m_code = 1;
    __wrap_memcpy(pEVar2 + 1,local_148.m_p,local_148.m_length);
    *(undefined1 *)((long)&pEVar2[1].m_size + local_148.m_length) = 0;
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_148);
  return size;
}

Assistant:

size_t
Error::formatStringError_va(
	const char* formatString,
	axl_va_list va
) {
	char buffer[256];
	sl::String string(rc::BufKind_Stack, buffer, sizeof(buffer));
	string.format_va(formatString, va);
	return createStringError(string);
}